

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall
nvim::Nvim::async_buf_clear_namespace
          (Nvim *this,Buffer buffer,Integer ns_id,Integer line_start,Integer line_end)

{
  allocator local_71;
  Integer local_70;
  Integer local_68;
  Integer local_60;
  Buffer local_58;
  string local_50;
  
  local_70 = line_end;
  local_68 = line_start;
  local_60 = ns_id;
  local_58 = buffer;
  std::__cxx11::string::string((string *)&local_50,"nvim_buf_clear_namespace",&local_71);
  NvimRPC::async_call<long,long,long,long>
            (&this->client_,&local_50,&local_58,&local_60,&local_68,&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Nvim::async_buf_clear_namespace(Buffer buffer, Integer ns_id, Integer line_start, Integer line_end) {
    client_.async_call("nvim_buf_clear_namespace", buffer, ns_id, line_start, line_end);
}